

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemInterface::handleTouchEvent<QWindowSystemInterface::DefaultDelivery>
               (QWindow *window,ulong timestamp,QPointingDevice *device,
               QList<QWindowSystemInterface::TouchPoint> *points,KeyboardModifiers mods)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  qsizetype qVar4;
  QList<QWindowSystemInterface::TouchPoint> *in_RCX;
  QList<QEventPoint> *in_RDX;
  QPointingDevice *in_RSI;
  QWindow *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QList<QEventPoint> touchPoints;
  Type type;
  QList<QEventPoint> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  QInputDevice *in_stack_ffffffffffffff80;
  Type args_2;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  QWindow *in_stack_ffffffffffffffc0;
  QFlagsStorage<Qt::KeyboardModifier> args_5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar4 = QList<QWindowSystemInterface::TouchPoint>::size(in_RCX);
  if (qVar4 == 0) {
    bVar3 = 0;
  }
  else {
    bVar2 = QInputDevicePrivate::isRegistered(in_stack_ffffffffffffff80);
    if (bVar2) {
      args_5.i = 0xaaaaaaaa;
      QWindowSystemInterfacePrivate::fromNativeTouchPoints
                ((QList<QWindowSystemInterface::TouchPoint> *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI,(Type *)in_RSI
                );
      args_2 = (Type)((ulong)in_RDI >> 0x20);
      QList<QEventPoint>::QList
                ((QList<QEventPoint> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)
                 ,in_stack_ffffffffffffff68);
      bVar3 = handleWindowSystemEvent<QWindowSystemInterfacePrivate::TouchEvent,QWindowSystemInterface::DefaultDelivery,QWindow*,unsigned_long,QEvent::Type,QPointingDevice_const*,QList<QEventPoint>,QFlags<Qt::KeyboardModifier>>
                        (in_stack_ffffffffffffffc0,CONCAT44(in_R8D,in_stack_ffffffffffffffb8),args_2
                         ,in_RSI,in_RDX,(QFlags<Qt::KeyboardModifier>)args_5.i);
      QList<QEventPoint>::~QList((QList<QEventPoint> *)0x445add);
      QList<QEventPoint>::~QList((QList<QEventPoint> *)0x445ae7);
    }
    else {
      bVar3 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

QT_DEFINE_QPA_EVENT_HANDLER(bool, handleTouchEvent, QWindow *window, ulong timestamp, const QPointingDevice *device,
                                              const QList<TouchPoint> &points, Qt::KeyboardModifiers mods)
{
    if (!points.size()) // Touch events must have at least one point
        return false;

    if (!QPointingDevicePrivate::isRegistered(device)) // Disallow passing bogus, non-registered devices.
        return false;

    QEvent::Type type;
    QList<QEventPoint> touchPoints =
            QWindowSystemInterfacePrivate::fromNativeTouchPoints(points, window, &type);

    return handleWindowSystemEvent<QWindowSystemInterfacePrivate::TouchEvent, Delivery>(window,
        timestamp, type, device, touchPoints, mods);
}